

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O2

int __thiscall sort_5_4::quick_sort_1(int *a,int mid,int low,int high)

{
  int *piVar1;
  int k;
  long lVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  int aiStack_18 [2];
  
  piVar1 = (int *)((long)aiStack_18 - ((ulong)(uint)(high - low) * 4 + 0xf & 0xfffffffffffffff0));
  lVar2 = (long)low;
  piVar5 = piVar1;
  for (lVar6 = lVar2; lVar6 <= high; lVar6 = lVar6 + 1) {
    *piVar5 = a[lVar6];
    piVar5 = piVar5 + 1;
  }
  iVar3 = mid + 1;
  iVar4 = low;
  do {
    if (mid < iVar4) {
      a[lVar2] = piVar1[iVar3 - low];
LAB_0010338c:
      iVar3 = iVar3 + 1;
    }
    else {
      if ((iVar3 <= high) && (piVar1[iVar3 - low] < piVar1[iVar4 - low])) {
        a[lVar2] = piVar1[iVar3 - low];
        goto LAB_0010338c;
      }
      a[lVar2] = piVar1[iVar4 - low];
      iVar4 = iVar4 + 1;
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

int merge_1(int *a, int mid, int low, int high) {
        int i = low, j = mid + 1, t[high - low];
        for (int k = low; k <= high; k++)
            t[k - low] = a[k];

        for (int k = low; k <= high; k++) {
            if (i > mid) {
                a[k] = t[j - low];
                j++;
            } else if (j > high) {
                a[k] = t[i - low];
                i++;
            } else if (t[i - low] > t[j - low]) {
                a[k] = t[j - low];
                j++;
            } else {
                a[k] = t[i - low];
                i++;
            }
        }

    }